

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O2

FT_UInt32 FT_Stream_GetULongLE(FT_Stream stream)

{
  FT_UInt32 FVar1;
  FT_UInt32 *pFVar2;
  
  pFVar2 = (FT_UInt32 *)stream->cursor;
  FVar1 = 0;
  if ((uchar *)((long)pFVar2 + 3U) < stream->limit) {
    FVar1 = *pFVar2;
    pFVar2 = pFVar2 + 1;
  }
  stream->cursor = (uchar *)pFVar2;
  return FVar1;
}

Assistant:

FT_BASE_DEF( FT_UInt32 )
  FT_Stream_GetULongLE( FT_Stream  stream )
  {
    FT_Byte*  p;
    FT_UInt32 result;


    FT_ASSERT( stream && stream->cursor );

    result         = 0;
    p              = stream->cursor;
    if ( p + 3 < stream->limit )
      result       = FT_NEXT_ULONG_LE( p );
    stream->cursor = p;
    return result;
  }